

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void C_SetAlias(char *name,char *cmd)

{
  uint uVar1;
  int iVar2;
  size_t namelen;
  FConsoleCommand *pFVar3;
  FConsoleAlias *this;
  FConsoleCommand *prev;
  FConsoleCommand *local_20;
  
  uVar1 = MakeKey(name);
  pFVar3 = Commands[uVar1 % 0xfb];
  namelen = strlen(name);
  pFVar3 = ScanChainForName(pFVar3,name,namelen,&local_20);
  if (pFVar3 != (FConsoleCommand *)0x0) {
    iVar2 = (*pFVar3->_vptr_FConsoleCommand[2])(pFVar3);
    if ((char)iVar2 == '\0') {
      return;
    }
    (*pFVar3->_vptr_FConsoleCommand[1])(pFVar3);
  }
  this = (FConsoleAlias *)operator_new(0x40);
  FConsoleAlias::FConsoleAlias(this,name,cmd,false);
  return;
}

Assistant:

void C_SetAlias (const char *name, const char *cmd)
{
	FConsoleCommand *prev, *alias, **chain;

	chain = &Commands[MakeKey (name) % FConsoleCommand::HASH_SIZE];
	alias = ScanChainForName (*chain, name, strlen (name), &prev);
	if (alias != NULL)
	{
		if (!alias->IsAlias ())
		{
			//Printf (PRINT_BOLD, "%s is a command and cannot be an alias.\n", name);
			return;
		}
		delete alias;
	}
	new FConsoleAlias (name, cmd, false);
}